

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O3

void __thiscall xmrig::Miner::execCommand(Miner *this,char command)

{
  pointer ppIVar1;
  uint uVar2;
  bool enabled;
  undefined7 in_register_00000031;
  pointer ppIVar4;
  ulong uVar3;
  
  uVar2 = (int)CONCAT71(in_register_00000031,command) - 0x48;
  uVar3 = (ulong)uVar2;
  if (uVar2 < 0x2b) {
    if ((0x100000001U >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0x10000000100U >> (uVar3 & 0x3f) & 1) == 0) {
        if ((0x40000000400U >> (uVar3 & 0x3f) & 1) == 0) goto LAB_0016f459;
        enabled = true;
      }
      else {
        enabled = false;
      }
      setEnabled(this,enabled);
    }
    else {
      printHashrate(this,true);
    }
  }
LAB_0016f459:
  ppIVar4 = (this->d_ptr->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar1 = (this->d_ptr->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar4 != ppIVar1) {
    do {
      (*(*ppIVar4)->_vptr_IBackend[6])(*ppIVar4,(ulong)(uint)(int)command);
      ppIVar4 = ppIVar4 + 1;
    } while (ppIVar4 != ppIVar1);
  }
  return;
}

Assistant:

void xmrig::Miner::execCommand(char command)
{
    switch (command) {
    case 'h':
    case 'H':
        printHashrate(true);
        break;

    case 'p':
    case 'P':
        setEnabled(false);
        break;

    case 'r':
    case 'R':
        setEnabled(true);
        break;

    default:
        break;
    }

    for (auto backend : d_ptr->backends) {
        backend->execCommand(command);
    }
}